

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

string * __thiscall
pbrt::ParameterDictionary::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ParameterDictionary *this)

{
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar1;
  size_t sVar2;
  RGBColorSpace *this_00;
  long *plVar3;
  size_type *psVar4;
  ulong *puVar5;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar6;
  long lVar7;
  string local_a0;
  string local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  ParameterDictionary *local_58;
  string local_50;
  
  local_60 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"[ ParameterDictionary params: ","");
  paVar1 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar2 = (this->params).nStored;
  paVar6 = &(this->params).field_2;
  if (paVar1 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar6 = paVar1;
  }
  local_58 = this;
  if (sVar2 != 0) {
    lVar7 = 0;
    do {
      ParsedParameter::ToString_abi_cxx11_(&local_50,*(ParsedParameter **)((long)paVar6 + lVar7));
      plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x28691f0);
      psVar4 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_80.field_2._M_allocated_capacity = *psVar4;
        local_80.field_2._8_8_ = plVar3[3];
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      }
      else {
        local_80.field_2._M_allocated_capacity = *psVar4;
        local_80._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_80._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_80);
      puVar5 = (ulong *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar5) {
        local_a0.field_2._M_allocated_capacity = *puVar5;
        local_a0.field_2._8_8_ = plVar3[3];
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      }
      else {
        local_a0.field_2._M_allocated_capacity = *puVar5;
        local_a0._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_a0._M_string_length = plVar3[1];
      *plVar3 = (long)puVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_a0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      lVar7 = lVar7 + 8;
    } while (sVar2 << 3 != lVar7);
  }
  this_00 = local_58->colorSpace;
  if (this_00 == (RGBColorSpace *)0x0) {
    local_50._M_dataplus._M_p = "<nullptr>";
  }
  else {
    RGBColorSpace::ToString_abi_cxx11_(&local_80,this_00);
    local_50._M_dataplus._M_p = local_80._M_dataplus._M_p;
  }
  local_a0._M_string_length = 0;
  local_a0.field_2._M_allocated_capacity =
       local_a0.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  detail::stringPrintfRecursive<char_const*>(&local_a0,"colorSpace: %s ",(char **)&local_50);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((this_00 != (RGBColorSpace *)0x0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2)) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string ParameterDictionary::ToString() const {
    std::string s = "[ ParameterDictionary params: ";
    for (const ParsedParameter *p : params) {
        s += "[ " + p->ToString() + "] ";
    }
    s += StringPrintf("colorSpace: %s ",
                      colorSpace ? colorSpace->ToString().c_str() : "<nullptr>");
    s += "]";
    return s;
}